

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O1

void __thiscall
writer_test_should_write_float_field_Test::TestBody(writer_test_should_write_float_field_Test *this)

{
  bool bVar1;
  size_t __n;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t sVar2;
  char *pcVar3;
  ostringstream local_1e0 [8];
  ostringstream oss;
  ios_base local_170 [264];
  undefined8 local_68;
  Field field;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  AssertHelper local_28;
  
  local_68 = 0x403159999999999a;
  field.val_.m_value._0_1_ = 0;
  std::__cxx11::ostringstream::ostringstream(local_1e0);
  Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<44U,_Fixpp::Type::Float>_>_>::write
            ((int)local_1e0,&local_68,__n);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
            ((internal *)&field.empty_,"oss.str()","\"44=17.35|\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
             ,(char (*) [10])"44=17.35|");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar.message_.ptr_ != &local_38) {
    operator_delete(gtest_ar.message_.ptr_,local_38._M_allocated_capacity + 1);
  }
  if (field.empty_ == false) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
               ,0x69,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
      }
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_68 = 0x4132d68773333333;
    field.val_.m_value._0_1_ = 0;
    pcVar3 = "";
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar.message_,"","");
    std::__cxx11::stringbuf::str((string *)&oss);
    sVar2 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)gtest_ar.message_.ptr_ != &local_38) {
      operator_delete(gtest_ar.message_.ptr_,local_38._M_allocated_capacity + 1);
      sVar2 = extraout_RDX_00;
    }
    Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<44U,_Fixpp::Type::Float>_>_>::write
              ((int)local_1e0,&local_68,sVar2);
    std::__cxx11::stringbuf::str();
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[15]>
              ((internal *)&field.empty_,"oss.str()","\"44=1234567.45|\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &gtest_ar.message_,(char (*) [15])"44=1234567.45|");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)gtest_ar.message_.ptr_ != &local_38) {
      operator_delete(gtest_ar.message_.ptr_,local_38._M_allocated_capacity + 1);
    }
    if (field.empty_ == false) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      if (gtest_ar._0_8_ != 0) {
        pcVar3 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
                 ,0x70,pcVar3);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_68 = 0x412e848000000000;
      field.val_.m_value._0_1_ = 0;
      pcVar3 = "";
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar.message_,"","");
      std::__cxx11::stringbuf::str((string *)&oss);
      sVar2 = extraout_RDX_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar.message_.ptr_ != &local_38) {
        operator_delete(gtest_ar.message_.ptr_,local_38._M_allocated_capacity + 1);
        sVar2 = extraout_RDX_02;
      }
      Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<44U,_Fixpp::Type::Float>_>_>::write
                ((int)local_1e0,&local_68,sVar2);
      std::__cxx11::stringbuf::str();
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[12]>
                ((internal *)&field.empty_,"oss.str()","\"44=1000000|\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &gtest_ar.message_,(char (*) [12])"44=1000000|");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar.message_.ptr_ != &local_38) {
        operator_delete(gtest_ar.message_.ptr_,local_38._M_allocated_capacity + 1);
      }
      if (field.empty_ == false) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        if (gtest_ar._0_8_ != 0) {
          pcVar3 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_28,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
                   ,0x77,pcVar3);
        testing::internal::AssertHelper::operator=(&local_28,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_28);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  std::__cxx11::ostringstream::~ostringstream(local_1e0);
  std::ios_base::~ios_base(local_170);
  return;
}

Assistant:

TEST(writer_test, should_write_float_field)
{
    using Field = Fixpp::Field<Fixpp::Tag::Price>;
    Field field;

    field.set(17.35);

    std::ostringstream oss;
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "44=17.35|");

    field.set(1234567.45);

    oss.str("");
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "44=1234567.45|");

    field.set(1000000.0);

    oss.str("");
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "44=1000000|");
}